

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

ostream * operator<<(ostream *out,Vehicle *v)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ostream *poVar4;
  Vehicle *in_RSI;
  Person *in_RDI;
  Vehicle *in_stack_ffffffffffffff98;
  Person *p;
  string local_30 [32];
  Vehicle *local_10;
  Person *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar3 = std::operator<<((ostream *)in_RDI,"Vehicle{");
  poVar3 = std::operator<<(poVar3," type: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10->type);
  poVar3 = std::operator<<(poVar3,", age: ");
  iVar2 = Vehicle::age(local_10);
  poVar4 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  poVar4 = std::operator<<(poVar4,", name: ");
  Vehicle::name_abi_cxx11_(in_stack_ffffffffffffff98);
  poVar4 = std::operator<<(poVar4,local_30);
  std::operator<<(poVar4,", owner: ");
  std::__cxx11::string::~string(local_30);
  Vehicle::owner(local_10);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Person,_std::default_delete<Person>_> *)0x1717b4);
  if (bVar1) {
    p = local_8;
    Vehicle::owner(local_10);
    std::unique_ptr<Person,_std::default_delete<Person>_>::operator*
              ((unique_ptr<Person,_std::default_delete<Person>_> *)poVar3);
    operator<<(poVar3,p);
  }
  else {
    std::operator<<((ostream *)local_8,"{null}");
  }
  poVar3 = std::operator<<((ostream *)local_8," }");
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Vehicle& v)
  {
    out << "Vehicle{"
        << " type: " << v.type
        << ", age: " << v.age()
        << ", name: " << v.name()
        << ", owner: ";
    if (v.owner()) { out << *v.owner(); }
    else { out << "{null}"; }
    return out << " }";
  }